

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

uint __thiscall ON_SubDMeshFragmentGrid::GridId(ON_SubDMeshFragmentGrid *this)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = 0;
  if (this->m_F == (uint *)0x0) {
    uVar2 = 0;
    while( true ) {
      do {
        uVar3 = uVar2;
        uVar2 = 0;
      } while (0x10 < uVar3);
      if (1 << ((byte)uVar3 & 0x1f) == (uint)this->m_F_count) break;
      uVar2 = uVar3 + 2;
    }
    uVar1 = this->m_F_level_of_detail;
    uVar2 = (uint)uVar1 + (uint)uVar1;
    if (uVar3 >> 1 < (uint)uVar1) {
      uVar2 = uVar3;
    }
    uVar2 = uVar3 * 0x10 + uVar2;
  }
  return uVar2;
}

Assistant:

unsigned int ON_SubDMeshFragmentGrid::GridId() const
{
  for (;;)
  {
    if (nullptr != m_F)
      break;

    // m_F_count = 2^(2n)
    for (unsigned int id = 0; id <= 16; id += 2)
    {
      if ((1U << id) == m_F_count)
      {
        id /= 2; // id = "n"
        unsigned int lod = (m_F_level_of_detail > id) ? id : (unsigned int)m_F_level_of_detail;
        id = 32*id + 2*lod;
        return id;
      }
    }
  }

  return 0;
}